

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O3

void __thiscall
amrex::MLABecLaplacian::copyNSolveSolution(MLABecLaplacian *this,MultiFab *dst,MultiFab *src)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  undefined8 uVar10;
  MFIter mfi;
  long local_1c0;
  Box local_16c;
  Array4<const_double> local_150;
  Array4<double> local_110;
  Array4<const_int> local_d0;
  MFIter local_90;
  
  if ((_Head_base<0UL,_amrex::iMultiFab_*,_false>)
      *(_Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_> *)
       &(*(pointer *)
          ((long)&(((this->super_MLCellABecLap).m_overset_mask.
                    super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                  ).
                  super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
          + 8))[-1]._M_t.
        super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> !=
      (iMultiFab *)0x0) {
    uVar2 = (dst->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
    MFIter::MFIter(&local_90,(FabArrayBase *)dst,true);
    if (local_90.currentIndex < local_90.endIndex) {
      do {
        MFIter::tilebox(&local_16c,&local_90);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_110,&dst->super_FabArray<amrex::FArrayBox>,&local_90);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_150,&src->super_FabArray<amrex::FArrayBox>,&local_90);
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  (&local_d0,
                   (FabArray<amrex::IArrayBox> *)
                   (*(pointer *)
                     ((long)&(((this->super_MLCellABecLap).m_overset_mask.
                               super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                             ).
                             super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                     + 8))[-1]._M_t.
                   super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,
                   &local_90);
        if (0 < (int)uVar2) {
          lVar1 = (long)local_16c.smallend.vect[0] * 8;
          local_1c0 = 0;
          uVar5 = 0;
          do {
            iVar3 = local_16c.smallend.vect[2];
            if (local_16c.smallend.vect[2] <= local_16c.bigend.vect[2]) {
              do {
                if (local_16c.smallend.vect[1] <= local_16c.bigend.vect[1]) {
                  lVar8 = (long)iVar3;
                  lVar4 = (long)local_d0.p +
                          ((long)local_16c.smallend.vect[1] - (long)local_d0.begin.y) *
                          local_d0.jstride * 4 + (lVar8 - local_d0.begin.z) * local_d0.kstride * 4 +
                          (long)local_d0.begin.x * -4 + (long)local_16c.smallend.vect[0] * 4;
                  lVar7 = (long)local_16c.smallend.vect[1];
                  do {
                    if (local_16c.smallend.vect[0] <= local_16c.bigend.vect[0]) {
                      lVar6 = 0;
                      do {
                        if (*(int *)(lVar4 + lVar6 * 4) == 0) {
                          uVar10 = 0;
                        }
                        else {
                          uVar10 = *(undefined8 *)
                                    ((long)local_150.p +
                                    lVar6 * 8 +
                                    local_150.nstride * local_1c0 +
                                    (lVar8 - local_150.begin.z) * local_150.kstride * 8 +
                                    (lVar7 - local_150.begin.y) * local_150.jstride * 8 +
                                    (long)local_150.begin.x * -8 + lVar1);
                        }
                        *(undefined8 *)
                         ((long)local_110.p +
                         lVar6 * 8 +
                         local_110.nstride * local_1c0 +
                         (lVar8 - local_110.begin.z) * local_110.kstride * 8 +
                         (lVar7 - local_110.begin.y) * local_110.jstride * 8 +
                         (long)local_110.begin.x * -8 + lVar1) = uVar10;
                        lVar6 = lVar6 + 1;
                      } while ((local_16c.bigend.vect[0] - local_16c.smallend.vect[0]) + 1 !=
                               (int)lVar6);
                    }
                    lVar7 = lVar7 + 1;
                    lVar4 = lVar4 + local_d0.jstride * 4;
                  } while (local_16c.bigend.vect[1] + 1 != (int)lVar7);
                }
                bVar9 = iVar3 != local_16c.bigend.vect[2];
                iVar3 = iVar3 + 1;
              } while (bVar9);
            }
            uVar5 = uVar5 + 1;
            local_1c0 = local_1c0 + 8;
          } while (uVar5 != uVar2);
        }
        MFIter::operator++(&local_90);
      } while (local_90.currentIndex < local_90.endIndex);
    }
    MFIter::~MFIter(&local_90);
  }
  return;
}

Assistant:

void
MLABecLaplacian::copyNSolveSolution (MultiFab& dst, MultiFab const& src) const
{
    if (m_overset_mask[0].back() == nullptr) return;

    const int ncomp = dst.nComp();

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && dst.isFusingCandidate()) {
        auto const& dstma = dst.arrays();
        auto const& srcma = src.const_arrays();
        auto const& mma = m_overset_mask[0].back()->const_arrays();
        ParallelFor(dst, IntVect(0), ncomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            if (mma[box_no](i,j,k)) {
                dstma[box_no](i,j,k,n) = srcma[box_no](i,j,k,n);
            } else {
                dstma[box_no](i,j,k,n) = Real(0.0);
            }
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(dst,TilingIfNotGPU()); mfi.isValid(); ++mfi) {
            Box const& bx = mfi.tilebox();
            Array4<Real> const& dfab = dst.array(mfi);
            Array4<Real const> const& sfab = src.const_array(mfi);
            Array4<int const> const& m = m_overset_mask[0].back()->const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
            {
                if (m(i,j,k)) {
                    dfab(i,j,k,n) = sfab(i,j,k,n);
                } else {
                    dfab(i,j,k,n) = Real(0.0);
                }
            });
        }
    }
}